

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# once_test.c
# Opt level: O3

void benchmark_native_once(testing t)

{
  int iVar1;
  int iVar2;
  unique_lock<std::mutex> local_38;
  
  iVar1 = testing_n(t);
  if (iVar1 != 0) {
    iVar2 = 0;
    do {
      if (nsync_pthread_once_(int*,void(*)())::cv == '\0') {
        benchmark_native_once();
      }
      local_38._M_device = (mutex_type *)nsync_pthread_once_(int*,void(*)())::mu;
      local_38._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_38);
      if (benchmark_native_once::o == 0) {
        benchmark_native_once::o = 1;
        std::unique_lock<std::mutex>::unlock(&local_38);
        std::unique_lock<std::mutex>::lock(&local_38);
        benchmark_native_once::o = 2;
        std::condition_variable::notify_all();
      }
      else {
        while (benchmark_native_once::o != 2) {
          std::condition_variable::wait((unique_lock *)nsync_pthread_once_(int*,void(*)())::cv);
        }
      }
      std::unique_lock<std::mutex>::unlock(&local_38);
      std::unique_lock<std::mutex>::~unique_lock(&local_38);
      iVar2 = iVar2 + 1;
    } while (iVar2 != iVar1);
  }
  return;
}

Assistant:

static void benchmark_native_once (testing t) {
	static pthread_once_t o = PTHREAD_ONCE_INIT;
	int n = testing_n (t);
	int i;
	for (i = 0; i != n; i++) {
		pthread_once (&o, &no_op);
	}
}